

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

int CmpLookup(void *p,void *va,void *vb)

{
  if (*va <= *vb) {
    if (*va < *vb) {
      return -1;
    }
    if (((*(char **)((long)va + 8) == (char *)0x0) || (*(long *)((long)vb + 8) == 0)) ||
       (**(char **)((long)va + 8) != '&')) {
      if ((*(char **)((long)vb + 8) != (char *)0x0) && (**(char **)((long)vb + 8) == '&')) {
        return -1;
      }
      if (va == p) {
        return 1;
      }
      return -(uint)(vb == p);
    }
  }
  return 1;
}

Assistant:

static NOINLINE int CmpLookup(const void* p, const void* va, const void* vb)
{
    const nodemetalookup* a = va;
    const nodemetalookup* b = vb;
    // sort by Id
    if (a->Id > b->Id) return 1;
    if (a->Id < b->Id) return -1;
    // make sure META_PARAM_BIT is after META_MODE_DATA
    if (a->Meta && b->Meta && a->Meta->Meta == META_PARAM_BIT) return 1;
    if (b->Meta && b->Meta && b->Meta->Meta == META_PARAM_BIT) return -1;
    // make sure META_PARAM_EVENT's are added in the order as they are found
    if (a==p) return 1;
    if (b==p) return -1;
    return 0;
}